

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::SetPolicy(cmMakefile *this,PolicyID id,PolicyStatus status)

{
  PolicyStatus PVar1;
  PolicyID id_00;
  string msg;
  
  if ((status != NEW) && (PVar1 = cmPolicies::GetPolicyStatus(id), PVar1 == REQUIRED_ALWAYS)) {
    cmPolicies::GetRequiredAlwaysPolicyError_abi_cxx11_(&msg,(cmPolicies *)(ulong)id,id_00);
    IssueMessage(this,FATAL_ERROR,&msg,false);
    std::__cxx11::string::~string((string *)&msg);
    return false;
  }
  cmState::Snapshot::SetPolicy(&this->StateSnapshot,id,status);
  return true;
}

Assistant:

bool cmMakefile::SetPolicy(cmPolicies::PolicyID id,
                           cmPolicies::PolicyStatus status)
{
  // A REQUIRED_ALWAYS policy may be set only to NEW.
  if(status != cmPolicies::NEW &&
     cmPolicies::GetPolicyStatus(id) ==
     cmPolicies::REQUIRED_ALWAYS)
    {
    std::string msg =
      cmPolicies::GetRequiredAlwaysPolicyError(id);
    this->IssueMessage(cmake::FATAL_ERROR, msg);
    return false;
    }

  this->StateSnapshot.SetPolicy(id, status);
  return true;
}